

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  Mat weight_data_int8;
  Mat local_f8;
  Mat weight_data_r2;
  Option opt_q;
  
  iVar2 = 0;
  if ((((this->dynamic_weight == 0) && (opt->use_int8_inference == true)) &&
      ((this->weight_data).elemsize == 4)) && (this->int8_scale_term != 0)) {
    iVar2 = this->kernel_h * this->kernel_w;
    uVar1 = (long)this->weight_data_size / (long)this->num_output;
    Mat::reshape(&weight_data_r2,&this->weight_data,iVar2,
                 (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                      (long)iVar2),this->num_output,(Allocator *)0x0);
    weight_data_int8.cstep = 0;
    weight_data_int8.data = (void *)0x0;
    weight_data_int8.refcount._0_4_ = 0;
    weight_data_int8.refcount._4_4_ = 0;
    weight_data_int8.elemsize._0_4_ = 0;
    weight_data_int8._20_8_ = 0;
    weight_data_int8.allocator = (Allocator *)0x0;
    weight_data_int8.dims = 0;
    weight_data_int8.w = 0;
    weight_data_int8.h = 0;
    weight_data_int8.d = 0;
    weight_data_int8.c = 0;
    opt_q.lightmode = opt->lightmode;
    opt_q._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_q.num_threads = opt->num_threads;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    uVar1._0_1_ = opt->use_bf16_storage;
    uVar1._1_1_ = opt->use_fp16_packed;
    uVar1._2_1_ = opt->use_fp16_storage;
    uVar1._3_1_ = opt->use_fp16_arithmetic;
    uVar1._4_1_ = opt->use_int8_packed;
    uVar1._5_1_ = opt->use_int8_storage;
    uVar1._6_1_ = opt->use_int8_arithmetic;
    uVar1._7_1_ = opt->use_packing_layout;
    opt_q.use_shader_pack8 = opt->use_shader_pack8;
    opt_q.use_subgroup_basic = opt->use_subgroup_basic;
    opt_q.use_subgroup_vote = opt->use_subgroup_vote;
    opt_q.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_q.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_weight_fp16_storage = opt->use_weight_fp16_storage;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = (this->weight_data).allocator;
    opt_q._32_8_ = uVar1 & 0xffffffffffffff;
    quantize_to_int8(&weight_data_r2,&weight_data_int8,&this->weight_data_int8_scales,&opt_q);
    if ((weight_data_int8.data == (void *)0x0) ||
       ((long)weight_data_int8.c * weight_data_int8.cstep == 0)) {
      Mat::~Mat(&weight_data_int8);
      Mat::~Mat(&weight_data_r2);
      iVar2 = -100;
    }
    else {
      Mat::reshape(&local_f8,&weight_data_int8,this->weight_data_size,(Allocator *)0x0);
      Mat::operator=(&this->weight_data,&local_f8);
      Mat::~Mat(&local_f8);
      Mat::~Mat(&weight_data_int8);
      Mat::~Mat(&weight_data_r2);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int maxk = kernel_w * kernel_h;
        const int num_input = weight_data_size / num_output / maxk;

        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        Mat weight_data_int8;

        Option opt_q = opt;
        opt_q.blob_allocator = weight_data.allocator;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}